

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_wav_preinit(ma_dr_wav *pWav,ma_dr_wav_read_proc onRead,ma_dr_wav_seek_proc onSeek,
                           void *pReadSeekUserData,ma_allocation_callbacks *pAllocationCallbacks)

{
  code *pcVar1;
  code *pcVar2;
  ma_bool32 mVar3;
  void *pvVar4;
  code *pcVar5;
  
  mVar3 = 0;
  if (onSeek != (ma_dr_wav_seek_proc)0x0 &&
      (onRead != (ma_dr_wav_read_proc)0x0 && pWav != (ma_dr_wav *)0x0)) {
    mVar3 = 0;
    memset(pWav,0,400);
    pWav->onRead = onRead;
    pWav->onSeek = onSeek;
    pWav->pUserData = pReadSeekUserData;
    if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
      pcVar5 = ma_dr_wav__malloc_default;
      pvVar4 = (void *)0x0;
      pcVar2 = ma_dr_wav__realloc_default;
      pcVar1 = ma_dr_wav__free_default;
    }
    else {
      pvVar4 = pAllocationCallbacks->pUserData;
      pcVar5 = pAllocationCallbacks->onMalloc;
      pcVar2 = pAllocationCallbacks->onRealloc;
      pcVar1 = pAllocationCallbacks->onFree;
    }
    (pWav->allocationCallbacks).pUserData = pvVar4;
    (pWav->allocationCallbacks).onMalloc = pcVar5;
    (pWav->allocationCallbacks).onRealloc = pcVar2;
    (pWav->allocationCallbacks).onFree = pcVar1;
    if ((pcVar1 != (_func_void_void_ptr_void_ptr *)0x0) &&
       (((pWav->allocationCallbacks).onMalloc != (_func_void_ptr_size_t_void_ptr *)0x0 ||
        ((pWav->allocationCallbacks).onRealloc != (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0))))
    {
      mVar3 = 1;
    }
  }
  return mVar3;
}

Assistant:

MA_PRIVATE ma_bool32 ma_dr_wav_preinit(ma_dr_wav* pWav, ma_dr_wav_read_proc onRead, ma_dr_wav_seek_proc onSeek, void* pReadSeekUserData, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pWav == NULL || onRead == NULL || onSeek == NULL) {
        return MA_FALSE;
    }
    MA_DR_WAV_ZERO_MEMORY(pWav, sizeof(*pWav));
    pWav->onRead    = onRead;
    pWav->onSeek    = onSeek;
    pWav->pUserData = pReadSeekUserData;
    pWav->allocationCallbacks = ma_dr_wav_copy_allocation_callbacks_or_defaults(pAllocationCallbacks);
    if (pWav->allocationCallbacks.onFree == NULL || (pWav->allocationCallbacks.onMalloc == NULL && pWav->allocationCallbacks.onRealloc == NULL)) {
        return MA_FALSE;
    }
    return MA_TRUE;
}